

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

vector<int,_std::allocator<int>_> * string_split<int>(string *str,char delim)

{
  bool bVar1;
  istream *__x;
  char in_DL;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  istringstream token_stream;
  int value;
  string token;
  istringstream str_stream;
  vector<int,_std::allocator<int>_> *values;
  vector<int,_std::allocator<int>_> *this;
  istringstream local_350 [388];
  int local_1cc;
  string local_1c8 [48];
  istringstream local_198 [390];
  byte local_12;
  char local_11;
  string *local_10;
  
  local_12 = 0;
  this = in_RDI;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1adbca);
  std::__cxx11::istringstream::istringstream(local_198,local_10,_S_in);
  std::__cxx11::string::string(local_1c8);
  while( true ) {
    __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_198,local_1c8,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::__cxx11::istringstream::istringstream(local_350,local_1c8,_S_in);
    std::istream::operator>>(local_350,&local_1cc);
    std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict *)__x);
    std::__cxx11::istringstream::~istringstream(local_350);
  }
  local_12 = 1;
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::istringstream::~istringstream(local_198);
  if ((local_12 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

static std::vector<T> string_split(const std::string & str, char delim) {
    static_assert(!std::is_same<T, std::string>::value, "Please use the specialized version for std::string");
    std::vector<T> values;
    std::istringstream str_stream(str);
    std::string token;
    while (std::getline(str_stream, token, delim)) {
        T value;
        std::istringstream token_stream(token);
        token_stream >> value;
        values.push_back(value);
    }
    return values;
}